

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

bool __thiscall Json::StyledStreamWriter::isMultineArray(StyledStreamWriter *this,Value *value)

{
  ArrayIndex AVar1;
  ArrayIndex AVar2;
  Value *pVVar3;
  byte bVar4;
  StyledStreamWriter *this_00;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  AVar1 = Value::size(value);
  bVar8 = this->rightMargin_ <= AVar1 * 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->childValues_,
                    (this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if (AVar1 != 0 && !bVar8) {
    uVar6 = 1;
    do {
      pVVar3 = Value::operator[](value,uVar6 - 1);
      bVar8 = Value::isArray(pVVar3);
      if (bVar8) {
LAB_004676d6:
        AVar2 = Value::size(pVVar3);
        bVar8 = AVar2 != 0;
      }
      else {
        bVar8 = Value::isObject(pVVar3);
        if (bVar8) goto LAB_004676d6;
        bVar8 = false;
      }
    } while ((uVar6 < AVar1) && (uVar6 = uVar6 + 1, bVar8 == false));
  }
  if (bVar8 == false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->childValues_,(ulong)AVar1);
    this->field_0x68 = this->field_0x68 | 1;
    uVar6 = AVar1 * 2 + 2;
    bVar4 = 0;
    if (AVar1 != 0) {
      lVar5 = 8;
      uVar7 = 0;
      do {
        this_00 = (StyledStreamWriter *)value;
        pVVar3 = Value::operator[](value,(ArrayIndex)uVar7);
        bVar8 = hasCommentForValue(this_00,pVVar3);
        if (bVar8) {
          bVar4 = 1;
        }
        pVVar3 = Value::operator[](value,(ArrayIndex)uVar7);
        writeValue(this,pVVar3);
        uVar6 = uVar6 + *(int *)((long)&(((this->childValues_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar5);
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + 0x20;
      } while (AVar1 != uVar7);
    }
    this->field_0x68 = this->field_0x68 & 0xfe;
    bVar8 = (bool)(this->rightMargin_ <= uVar6 | bVar4);
  }
  return bVar8;
}

Assistant:

bool StyledStreamWriter::isMultineArray(const Value& value) {
  ArrayIndex const size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (ArrayIndex index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine = ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    ArrayIndex lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (ArrayIndex index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += static_cast<ArrayIndex>(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}